

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  bool bVar1;
  string *psVar2;
  ArenaStringPtr *pAVar3;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_20,&local_28);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    psVar2 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        *(string **)(field + 0x90));
  }
  else {
    bVar1 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar1) {
      psVar2 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    }
    else {
      pAVar3 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      psVar2 = pAVar3->ptr_;
    }
  }
  return psVar2;
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }
  }
}